

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O0

void __thiscall unregistered_options::test_method(unregistered_options *this)

{
  bool bVar1;
  undefined1 uVar2;
  pointer poVar3;
  vw_exception *ex;
  option_group_definition arg_group;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_> options;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  int argc;
  char command_line [31];
  int int_opt;
  pointer in_stack_fffffffffffffb88;
  undefined8 uVar4;
  typed_option<int> *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  undefined6 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba6;
  undefined1 in_stack_fffffffffffffba7;
  char **in_stack_fffffffffffffbd0;
  undefined8 uVar5;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  options_boost_po *in_stack_fffffffffffffbe0;
  basic_cstring<const_char> local_348;
  undefined1 local_338 [32];
  undefined1 local_318 [24];
  undefined1 local_300 [16];
  basic_cstring<const_char> local_2f0;
  undefined1 local_2e0 [16];
  basic_cstring<const_char> local_2d0;
  undefined1 local_2bc [20];
  undefined1 local_2a8 [40];
  undefined1 local_280 [16];
  basic_cstring<const_char> local_270 [7];
  basic_cstring<const_char> local_1f8;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [16];
  basic_cstring<const_char> local_1a0;
  allocator local_189;
  string local_188 [199];
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [104];
  char local_38 [36];
  undefined1 local_14 [20];
  
  builtin_strncpy(local_38,"exe --int_opt 3 --str_opt test",0x1f);
  convert_to_command_args
            ((char *)CONCAT17(in_stack_fffffffffffffba7,
                              CONCAT16(in_stack_fffffffffffffba6,in_stack_fffffffffffffba0)),
             (int *)in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  std::unique_ptr<char*,std::default_delete<char*>>::unique_ptr<std::default_delete<char*>,void>
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)in_stack_fffffffffffffb90,
             (pointer)in_stack_fffffffffffffb88);
  operator_new(0x2e8);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::get
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)in_stack_fffffffffffffb90);
  VW::config::options_boost_po::options_boost_po
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd0);
  std::unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>>::
  unique_ptr<std::default_delete<VW::config::options_boost_po>,void>
            ((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::unique_ptr<VW::config::options_i,std::default_delete<VW::config::options_i>>::
  unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>,void>
            ((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_> *)
             CONCAT17(in_stack_fffffffffffffba7,
                      CONCAT16(in_stack_fffffffffffffba6,in_stack_fffffffffffffba0)),
             (unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)in_stack_fffffffffffffb98);
  std::unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
  ::~unique_ptr((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
                 *)in_stack_fffffffffffffb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"group1",&local_c1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb90,
             (string *)in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"int_opt",&local_189);
  VW::config::make_option<int>(in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  VW::config::option_group_definition::add<int>
            ((option_group_definition *)in_stack_fffffffffffffbe0,
             (typed_option<int> *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  VW::config::typed_option<int>::~typed_option(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  do {
    poVar3 = std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::
             operator->((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
                         *)0x13795f);
    (**poVar3->_vptr_options_i)(poVar3,local_a0);
    do {
      uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      uVar2 = (undefined1)((ulong)in_stack_fffffffffffffb88 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x76);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb90);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_1a0,0x14f,local_1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffb90,(bool)uVar2);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffb98,(char (*) [58])in_stack_fffffffffffffb90)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x76);
      in_stack_fffffffffffffb88 = (pointer)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1c8,local_1e8,&local_1f8,0x14f,1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[58],_const_char_(&)[58]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[58],_const_char_(&)[58]>
                          *)0x137a75);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x137a82);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_270,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,local_270,0x150,local_280);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb98,(char (*) [1])in_stack_fffffffffffffb90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2bc + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x76);
    local_2bc._0_4_ = 3;
    in_stack_fffffffffffffb98 = (string *)0x41098c;
    in_stack_fffffffffffffb90 = (typed_option<int> *)local_2bc;
    uVar4 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_2a8,local_2bc + 4,0x150,1,2,local_14);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x137e41);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_2d0,0x152,local_2e0);
    poVar3 = std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::
             operator->((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
                         *)0x137ec0);
    (*poVar3->_vptr_options_i[7])();
    do {
      uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      uVar2 = (undefined1)((ulong)uVar4 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x76);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb90);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_2f0,0x152,local_300);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffb90,(bool)uVar2);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffb98,(char (*) [51])in_stack_fffffffffffffb90)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_348,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x76);
      uVar4 = 0;
      boost::test_tools::tt_detail::report_assertion(local_318,local_338,&local_348,0x152,1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                          *)0x137fc0);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x137fcd);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb90);
  std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::~unique_ptr
            ((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_> *)
             CONCAT17(in_stack_fffffffffffffba7,CONCAT16(uVar2,in_stack_fffffffffffffba0)));
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)in_stack_fffffffffffffb90);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(unregistered_options) {
  int int_opt;

  char command_line[] = "exe --int_opt 3 --str_opt test";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group1");
  arg_group.add(make_option("int_opt", int_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));
  BOOST_CHECK_EQUAL(int_opt, 3);

  BOOST_CHECK_THROW(options->check_unregistered(), VW::vw_exception);
}